

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_ea_ea(m68k_info *info,int opcode,int size)

{
  cs_m68k *op;
  undefined4 in_EDX;
  undefined4 in_ESI;
  cs_m68k *ext;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  undefined8 in_stack_ffffffffffffffe0;
  cs_m68k_op *pcVar1;
  undefined8 in_stack_ffffffffffffffe8;
  
  op = build_init_op((m68k_info *)CONCAT44(in_ESI,in_EDX),
                     (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),(int)in_stack_ffffffffffffffe8,
                     (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  pcVar1 = op->operands + 1;
  get_ea_mode_op((m68k_info *)CONCAT44(in_ESI,in_EDX),op->operands,(uint)((ulong)pcVar1 >> 0x20),
                 (uint)pcVar1);
  get_ea_mode_op((m68k_info *)CONCAT44(in_ESI,in_EDX),op->operands,(uint)((ulong)pcVar1 >> 0x20),
                 (uint)pcVar1);
  return;
}

Assistant:

static void build_ea_ea(m68k_info *info, int opcode, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	get_ea_mode_op(info, op0, info->ir, size);
	get_ea_mode_op(info, op1, (((info->ir>>9) & 7) | ((info->ir>>3) & 0x38)), size);
}